

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppendWithAnnotations.cpp
# Opt level: O1

EStatusCode EmbedPagesInPDF(PDFWriter *inTargetWriter,string *inSourcePDF)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  bool bVar3;
  EPDFObjectType EVar4;
  EStatusCode EVar5;
  DocumentContext *pDVar6;
  PDFParsingOptions *inOptions;
  PDFDocumentCopyingContext *this;
  PDFParser *pPVar7;
  PDFDictionary *pPVar8;
  ObjectsContext *this_00;
  _func_int **inAnnotationObjectRef;
  unsigned_long inPageIndex;
  EStatusCodeAndObjectIDType EVar9;
  RefCountPtr<PDFObject> annotsObject;
  RefCountPtr<PDFDictionary> pageDictionary;
  EStatusCodeAndObjectIDTypeList result;
  AnnotationsWriter annotationsWriter;
  RefCountPtr<PDFObject> local_d8;
  RefCountPtr<PDFDictionary> local_c8;
  string local_b8;
  PDFDocumentCopyingContext *local_98;
  PDFWriter *local_90;
  unsigned_long local_88;
  EStatusCodeAndObjectIDTypeList local_80;
  string local_60;
  AnnotationsWriter local_40;
  
  AnnotationsWriter::AnnotationsWriter(&local_40);
  pDVar6 = PDFWriter::GetDocumentContext(inTargetWriter);
  PDFHummus::DocumentContext::AddDocumentContextExtender
            (pDVar6,(IDocumentContextExtender *)&local_40);
  inOptions = PDFParsingOptions::DefaultPDFParsingOptions();
  this = PDFWriter::CreatePDFCopyingContext(inTargetWriter,inSourcePDF,inOptions);
  if (this == (PDFDocumentCopyingContext *)0x0) {
    EVar5 = eFailure;
  }
  else {
    pPVar7 = PDFDocumentCopyingContext::GetSourceDocumentParser(this);
    local_88 = PDFParser::GetPagesCount(pPVar7);
    if (local_88 == 0) {
      EVar5 = eSuccess;
    }
    else {
      inPageIndex = 0;
      local_98 = this;
      local_90 = inTargetWriter;
      do {
        pPVar7 = PDFDocumentCopyingContext::GetSourceDocumentParser(this);
        pPVar8 = PDFParser::ParsePage(pPVar7,inPageIndex);
        local_c8._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_003a9720;
        local_c8.mValue = pPVar8;
        local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"Annots","");
        bVar3 = PDFDictionary::Exists(pPVar8,&local_60);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
        pPVar8 = local_c8.mValue;
        if (bVar3) {
          local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Annots","");
          local_d8.mValue = PDFDictionary::QueryDirectObject(pPVar8,&local_b8);
          local_d8._vptr_RefCountPtr = (_func_int **)&PTR__RefCountPtr_003a9780;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
          EVar4 = PDFObject::GetType(local_d8.mValue);
          if (EVar4 == ePDFObjectIndirectObjectReference) {
            inAnnotationObjectRef = local_d8.mValue[1].super_RefCountObject._vptr_RefCountObject;
            EVar5 = eSuccess;
LAB_0012a5f2:
            bVar3 = true;
            AnnotationsWriter::SetAnnotationObjectReference
                      (&local_40,(ObjectIDType)inAnnotationObjectRef);
          }
          else {
            this_00 = PDFWriter::GetObjectsContext(inTargetWriter);
            inAnnotationObjectRef = (_func_int **)ObjectsContext::StartNewIndirectObject(this_00);
            if (inAnnotationObjectRef == (_func_int **)0x0) {
              EVar5 = eFailure;
              bVar3 = false;
            }
            else {
              PDFDocumentCopyingContext::CopyDirectObjectWithDeepCopy_abi_cxx11_
                        (&local_80,this,local_d8.mValue);
              if (local_80.first == eSuccess) {
                ObjectsContext::EndIndirectObject(this_00);
                EVar5 = PDFDocumentCopyingContext::CopyNewObjectsForDirectObject
                                  (this,&local_80.second);
                bVar3 = EVar5 == eSuccess;
              }
              else {
                bVar3 = false;
                EVar5 = local_80.first;
              }
              this = local_98;
              inTargetWriter = local_90;
              p_Var2 = local_80.second.
                       super__List_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       _M_node.super__List_node_base._M_next;
              while (local_98 = this, local_90 = inTargetWriter,
                    p_Var2 != (_List_node_base *)&local_80.second) {
                p_Var1 = p_Var2->_M_next;
                operator_delete(p_Var2,0x18);
                this = local_98;
                inTargetWriter = local_90;
                p_Var2 = p_Var1;
              }
            }
            if (bVar3) goto LAB_0012a5f2;
            bVar3 = false;
          }
          RefCountPtr<PDFObject>::~RefCountPtr(&local_d8);
          if (bVar3) goto LAB_0012a61f;
          bVar3 = false;
        }
        else {
LAB_0012a61f:
          EVar9 = PDFDocumentCopyingContext::AppendPDFPageFromPDF(this,inPageIndex);
          EVar5 = EVar9.first;
          bVar3 = true;
        }
        RefCountPtr<PDFDictionary>::~RefCountPtr(&local_c8);
      } while (((bVar3) && (inPageIndex = inPageIndex + 1, inPageIndex < local_88)) &&
              (EVar5 == eSuccess));
    }
  }
  if (this != (PDFDocumentCopyingContext *)0x0) {
    PDFDocumentCopyingContext::~PDFDocumentCopyingContext(this);
    operator_delete(this,0xd0);
  }
  pDVar6 = PDFWriter::GetDocumentContext(inTargetWriter);
  PDFHummus::DocumentContext::RemoveDocumentContextExtender
            (pDVar6,(IDocumentContextExtender *)&local_40);
  return EVar5;
}

Assistant:

EStatusCode EmbedPagesInPDF(PDFWriter* inTargetWriter, const string& inSourcePDF)
{
	EStatusCode status = eSuccess;
	PDFDocumentCopyingContext* copyingContext;
	AnnotationsWriter annotationsWriter;
	
	inTargetWriter->GetDocumentContext().AddDocumentContextExtender(&annotationsWriter);
	do
	{

		copyingContext = inTargetWriter->CreatePDFCopyingContext(inSourcePDF);
		if(!copyingContext)
		{
			status = eFailure;
			break;
		}

		unsigned long pagesCount = copyingContext->GetSourceDocumentParser()->GetPagesCount();
		for(unsigned long i=0; i < pagesCount && eSuccess == status; ++i)
		{
			RefCountPtr<PDFDictionary> pageDictionary(copyingContext->GetSourceDocumentParser()->ParsePage(i));

			if(pageDictionary->Exists("Annots")) {
				// just copy the annots object into an indirect object, if it's not already that...later we can just attach the ref to the page.
				// copying will take care of recreating the annots object and internal object in whatever way there are in the original document,
				// so no need ot worry about whether they are references or direct objects
				ObjectIDType annotsRef;
				RefCountPtr<PDFObject> annotsObject = pageDictionary->QueryDirectObject("Annots");

				if(annotsObject->GetType() == PDFObject::ePDFObjectIndirectObjectReference) {
					annotsRef = ((PDFIndirectObjectReference*)(annotsObject.GetPtr()))->mObjectID;
				} else {
					// direct object. recreate as indirect, for the sake of simplicity. after its done copying, copy what indirect objects
					// it refers to (indirect annotation objects...normally)
					ObjectsContext& objectsContext = inTargetWriter->GetObjectsContext();

					annotsRef = objectsContext.StartNewIndirectObject();	
					if(annotsRef == 0) {
						status = eFailure;
						break;
					}
					EStatusCodeAndObjectIDTypeList result = copyingContext->CopyDirectObjectWithDeepCopy(annotsObject.GetPtr());

					status = result.first;
					if(status != eSuccess)
					 	break;

					objectsContext.EndIndirectObject();

					// done copying the annots object, now copy its depenencies
					status = copyingContext->CopyNewObjectsForDirectObject(result.second);
					if(status != eSuccess)
						break;
				}

				// report to end page handler, so it can use this reference when writing the page
				annotationsWriter.SetAnnotationObjectReference(annotsRef);

			}

			status = copyingContext->AppendPDFPageFromPDF(i).first;

		}
	} while(false);

	delete copyingContext;
	inTargetWriter->GetDocumentContext().RemoveDocumentContextExtender(&annotationsWriter);
	return status;
}